

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::Impl::requireStructSize
          (Impl *this,uint64_t id,uint dataWordCount,uint pointerCount)

{
  HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize> *table;
  ushort uVar1;
  Entry *pEVar2;
  RawSchema **schema;
  ushort uVar3;
  uint16_t uVar4;
  uint64_t id_local;
  Entry local_48;
  Impl<0UL,_false> local_38;
  undefined7 uStack_37;
  long local_30;
  
  table = &this->structSizeRequirements;
  local_48.value = (RequiredSize)(dataWordCount & 0xffff | pointerCount << 0x10);
  local_48.key = id;
  kj::
  Table<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>_>
  ::Impl<0UL,_false>::insert
            (&local_38,&table->table,
             (long)(this->structSizeRequirements).table.rows.builder.pos -
             (long)(this->structSizeRequirements).table.rows.builder.ptr >> 4,&local_48,0xffffffff);
  if (local_38 == (Impl<0UL,_false>)0x1) {
    pEVar2 = (table->table).rows.builder.ptr;
    uVar1 = pEVar2[local_30].value.dataWordCount;
    uVar3 = local_48.value.dataWordCount;
    if (local_48.value.dataWordCount < uVar1) {
      uVar3 = uVar1;
    }
    pEVar2[local_30].value.dataWordCount = uVar3;
    uVar1 = pEVar2[local_30].value.pointerCount;
    uVar4 = local_48.value.pointerCount;
    if (local_48.value.pointerCount < uVar1) {
      uVar4 = uVar1;
    }
    pEVar2[local_30].value.pointerCount = uVar4;
  }
  else {
    kj::Vector<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry>::
    add<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry>
              ((Vector<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry> *)
               table,&local_48);
  }
  kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long&>
            ((HashMap<unsigned_long,capnp::_::RawSchema*> *)&local_38,
             (unsigned_long *)&this->schemas);
  if ((undefined8 *)CONCAT71(uStack_37,local_38) != (undefined8 *)0x0) {
    applyStructSizeRequirement
              (this,*(RawSchema **)CONCAT71(uStack_37,local_38),dataWordCount,pointerCount);
  }
  return;
}

Assistant:

void SchemaLoader::Impl::requireStructSize(uint64_t id, uint dataWordCount, uint pointerCount) {
  structSizeRequirements.upsert(id, { uint16_t(dataWordCount), uint16_t(pointerCount) },
      [&](RequiredSize& existingValue, RequiredSize&& newValue) {
    existingValue.dataWordCount = kj::max(existingValue.dataWordCount, newValue.dataWordCount);
    existingValue.pointerCount = kj::max(existingValue.pointerCount, newValue.pointerCount);
  });

  KJ_IF_SOME(schema, schemas.find(id)) {
    applyStructSizeRequirement(schema, dataWordCount, pointerCount);
  }
}